

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void FilterLoop24_C(uint8_t *p,int hstride,int vstride,int size,int thresh,int ithresh,
                   int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  int iVar6;
  long lVar7;
  
  for (; 0 < size; size = size + -1) {
    iVar6 = NeedsFilter2_C(p,hstride,thresh * 2 + 1,ithresh);
    if (iVar6 != 0) {
      iVar6 = Hev(p,hstride,hev_thresh);
      if (iVar6 == 0) {
        bVar1 = p[-hstride];
        bVar2 = *p;
        bVar3 = p[hstride];
        iVar6 = (uint)bVar2 - (uint)bVar1;
        uVar4 = sclip2[(long)(iVar6 * 3 + 4 >> 3) + 0x70];
        uVar5 = sclip2[(long)(iVar6 * 3 + 3 >> 3) + 0x70];
        lVar7 = (long)((char)uVar4 + 1 >> 1);
        p[hstride * -2] = ""[(ulong)p[hstride * -2] + lVar7 + 0xff];
        p[-hstride] = ""[(long)(char)uVar5 + (ulong)bVar1 + 0xff];
        *p = ""[((ulong)bVar2 - (long)(char)uVar4) + 0xff];
        p[hstride] = ""[((ulong)bVar3 - lVar7) + 0xff];
      }
      else {
        DoFilter2_C(p,hstride);
      }
    }
    p = p + vstride;
  }
  return;
}

Assistant:

static WEBP_INLINE void FilterLoop24_C(uint8_t* p,
                                       int hstride, int vstride, int size,
                                       int thresh, int ithresh,
                                       int hev_thresh) {
  const int thresh2 = 2 * thresh + 1;
  while (size-- > 0) {
    if (NeedsFilter2_C(p, hstride, thresh2, ithresh)) {
      if (Hev(p, hstride, hev_thresh)) {
        DoFilter2_C(p, hstride);
      } else {
        DoFilter4_C(p, hstride);
      }
    }
    p += vstride;
  }
}